

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

bool google::protobuf::compiler::ApplyMapping
               (string *filename,string *old_prefix,string *new_prefix,string *result)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  bool local_a9;
  undefined1 local_98 [8];
  string after_prefix;
  undefined1 auStack_70 [4];
  int after_prefix_start;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  string *local_30;
  string *result_local;
  string *new_prefix_local;
  string *old_prefix_local;
  string *filename_local;
  
  local_30 = result;
  result_local = new_prefix;
  new_prefix_local = old_prefix;
  old_prefix_local = filename;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    bVar2 = ContainsParentReference(old_prefix_local);
    if (bVar2) {
      filename_local._7_1_ = 0;
    }
    else {
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_40,old_prefix_local);
      stringpiece_internal::StringPiece::StringPiece(&local_50,"/");
      bVar2 = HasPrefixString(local_40,local_50);
      local_a9 = true;
      if (!bVar2) {
        local_a9 = IsWindowsAbsolutePath(old_prefix_local);
      }
      if (local_a9 == false) {
        std::__cxx11::string::assign((string *)local_30);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::push_back((char)local_30);
        }
        std::__cxx11::string::append((string *)local_30);
        filename_local._7_1_ = 1;
      }
      else {
        filename_local._7_1_ = 0;
      }
    }
    goto LAB_0062c4a1;
  }
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_60,old_prefix_local);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            ((StringPiece *)auStack_70,new_prefix_local);
  bVar2 = HasPrefixString(local_60,_auStack_70);
  if (bVar2) {
    lVar5 = std::__cxx11::string::size();
    lVar6 = std::__cxx11::string::size();
    psVar1 = old_prefix_local;
    if (lVar5 == lVar6) {
      std::__cxx11::string::operator=((string *)local_30,(string *)result_local);
      filename_local._7_1_ = 1;
      goto LAB_0062c4a1;
    }
    after_prefix.field_2._12_4_ = 0xffffffff;
    std::__cxx11::string::size();
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
    psVar1 = old_prefix_local;
    if (*pcVar7 == '/') {
      iVar3 = std::__cxx11::string::size();
      after_prefix.field_2._12_4_ = iVar3 + 1;
    }
    else {
      std::__cxx11::string::size();
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
      if (*pcVar7 == '/') {
        after_prefix.field_2._12_4_ = std::__cxx11::string::size();
      }
    }
    if (after_prefix.field_2._12_4_ != -1) {
      std::__cxx11::string::substr((ulong)local_98,(ulong)old_prefix_local);
      bVar2 = ContainsParentReference((string *)local_98);
      if (bVar2) {
        filename_local._7_1_ = 0;
      }
      else {
        std::__cxx11::string::assign((string *)local_30);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::push_back((char)local_30);
        }
        std::__cxx11::string::append((string *)local_30);
        filename_local._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_98);
      goto LAB_0062c4a1;
    }
  }
  filename_local._7_1_ = 0;
LAB_0062c4a1:
  return (bool)(filename_local._7_1_ & 1);
}

Assistant:

static bool ApplyMapping(const std::string& filename,
                         const std::string& old_prefix,
                         const std::string& new_prefix, std::string* result) {
  if (old_prefix.empty()) {
    // old_prefix matches any relative path.
    if (ContainsParentReference(filename)) {
      // We do not allow the file name to use "..".
      return false;
    }
    if (HasPrefixString(filename, "/") || IsWindowsAbsolutePath(filename)) {
      // This is an absolute path, so it isn't matched by the empty string.
      return false;
    }
    result->assign(new_prefix);
    if (!result->empty()) result->push_back('/');
    result->append(filename);
    return true;
  } else if (HasPrefixString(filename, old_prefix)) {
    // old_prefix is a prefix of the filename.  Is it the whole filename?
    if (filename.size() == old_prefix.size()) {
      // Yep, it's an exact match.
      *result = new_prefix;
      return true;
    } else {
      // Not an exact match.  Is the next character a '/'?  Otherwise,
      // this isn't actually a match at all.  E.g. the prefix "foo/bar"
      // does not match the filename "foo/barbaz".
      int after_prefix_start = -1;
      if (filename[old_prefix.size()] == '/') {
        after_prefix_start = old_prefix.size() + 1;
      } else if (filename[old_prefix.size() - 1] == '/') {
        // old_prefix is never empty, and canonicalized paths never have
        // consecutive '/' characters.
        after_prefix_start = old_prefix.size();
      }
      if (after_prefix_start != -1) {
        // Yep.  So the prefixes are directories and the filename is a file
        // inside them.
        std::string after_prefix = filename.substr(after_prefix_start);
        if (ContainsParentReference(after_prefix)) {
          // We do not allow the file name to use "..".
          return false;
        }
        result->assign(new_prefix);
        if (!result->empty()) result->push_back('/');
        result->append(after_prefix);
        return true;
      }
    }
  }

  return false;
}